

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O1

FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_> * __thiscall
FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
::operator[](FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
             *this,unsigned_long *key)

{
  pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>
  *ppVar1;
  const_iterator __position;
  ulong uVar2;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  tuple<> local_9;
  tuple<const_unsigned_long_&> local_8;
  
  __position._M_current =
       (this->vec_).
       super__Vector_base<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->vec_).
           super__Vector_base<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = (long)ppVar1 - (long)__position._M_current;
  if (0 < (long)uVar2) {
    uVar2 = (uVar2 >> 3) * -0x3333333333333333;
    do {
      uVar3 = uVar2 >> 1;
      uVar4 = uVar3;
      if (__position._M_current[uVar3].first < *key) {
        uVar4 = ~uVar3 + uVar2;
        __position._M_current = __position._M_current + uVar3 + 1;
      }
      uVar2 = uVar4;
    } while (0 < (long)uVar4);
  }
  if ((__position._M_current == ppVar1) || (*key < (__position._M_current)->first)) {
    local_8.super__Tuple_impl<0UL,_const_unsigned_long_&>.
    super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_unsigned_long_&>)(_Tuple_impl<0UL,_const_unsigned_long_&>)key;
    __position._M_current =
         (pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>
          *)std::
            vector<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>,std::allocator<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>>>
            ::
            _M_emplace_aux<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                      ((vector<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>,std::allocator<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>>>
                        *)this,__position,(piecewise_construct_t *)&std::piecewise_construct,
                       &local_8,&local_9);
  }
  return &(__position._M_current)->second;
}

Assistant:

T& operator[](const Key& key) {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.emplace(pos, std::piecewise_construct, std::forward_as_tuple(key), std::tuple<>())->second;
        } else {
            return pos->second;
        }
    }